

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 05-channels.cpp
# Opt level: O3

int main(void)

{
  pointer pcVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  Slacking *pSVar5;
  ostream *poVar6;
  Channel *v;
  Channel *pCVar7;
  Channel *channel;
  string channel_id;
  vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_> channels;
  string mytoken;
  ifstream infile;
  undefined1 local_2a0 [16];
  undefined1 local_290 [40];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  size_type local_238 [65];
  
  local_258._8_8_ = 0;
  local_248._M_local_buf[0] = '\0';
  local_258._0_8_ = &local_248;
  std::ifstream::ifstream(local_238,"token.txt",_S_in);
  cVar3 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] - 0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)local_258,cVar3);
  if ((slack::_detail::create(std::__cxx11::string_const&,bool)::instance == '\0') &&
     (iVar4 = __cxa_guard_acquire(&slack::_detail::create(std::__cxx11::string_const&,bool)::
                                   instance), iVar4 != 0)) {
    slack::_detail::Slacking::Slacking
              ((Slacking *)slack::_detail::create(std::__cxx11::string_const&,bool)::instance,
               (string *)local_258,true);
    __cxa_atexit(slack::_detail::Slacking::~Slacking,
                 slack::_detail::create(std::__cxx11::string_const&,bool)::instance,&__dso_handle);
    __cxa_guard_release(&slack::_detail::create(std::__cxx11::string_const&,bool)::instance);
  }
  pSVar5 = slack::_detail::instance();
  slack::_detail::CategoryConversations::list_abi_cxx11_
            ((CategoryConversations *)local_2a0,(bool)((char)pSVar5 + -0x10));
  poVar6 = nlohmann::operator<<
                     ((ostream *)&std::cout,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_2a0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_2a0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::json_value::destroy((json_value *)(local_2a0 + 8),(value_t)local_2a0[0]);
  pSVar5 = slack::_detail::instance();
  slack::_detail::CategoryConversations::list_magic
            ((vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_> *)
             (local_290 + 0x10),&pSVar5->conversations,false);
  local_2a0[0] = (string)0x5b;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_2a0,1);
  uVar2 = local_290._24_8_;
  if (local_290._16_8_ != local_290._24_8_) {
    pCVar7 = (Channel *)local_290._16_8_;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n  ",3);
      poVar6 = slack::_detail::operator<<((ostream *)&std::cout,pCVar7);
      local_2a0[0] = (string)0x2c;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2a0,1);
      pCVar7 = pCVar7 + 1;
    } while (pCVar7 != (Channel *)uVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\b\n]",3);
  local_2a0[0] = (string)0xa;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_2a0,1);
  for (pCVar7 = (Channel *)local_290._16_8_; pCVar7 != (Channel *)local_290._24_8_;
      pCVar7 = pCVar7 + 1) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(pCVar7->name)._M_dataplus._M_p,
                        (pCVar7->name)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  pcVar1 = (((Channel *)local_290._16_8_)->id)._M_dataplus._M_p;
  local_2a0._0_8_ = (Slacking *)local_290;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a0,pcVar1,
             pcVar1 + (((Channel *)local_290._16_8_)->id)._M_string_length);
  pSVar5 = slack::_detail::instance();
  slack::_detail::CategoryConversations::info
            ((CategoryConversations *)local_268,(string *)&pSVar5->conversations);
  poVar6 = nlohmann::operator<<
                     ((ostream *)&std::cout,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_268);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_268);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::json_value::destroy((json_value *)(local_268 + 8),local_268[0]);
  if ((Slacking *)local_2a0._0_8_ != (Slacking *)local_290) {
    operator_delete((void *)local_2a0._0_8_);
  }
  std::vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_>::~vector
            ((vector<slack::_detail::Channel,_std::allocator<slack::_detail::Channel>_> *)
             (local_290 + 0x10));
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._0_8_ != &local_248) {
    operator_delete((void *)local_258._0_8_);
  }
  return 0;
}

Assistant:

int main() {
    // Load the token from a file. You can also specify directly the token in your code as a string.
    std::string mytoken;
    std::ifstream infile("token.txt");
    std::getline(infile, mytoken);

    slack::create(mytoken);
    
    // You can display all the JSON response
    std::cout << slack::instance().conversations.list() << std::endl; 

    // You can display filtered informations
    auto channels = slack::conversations().list_magic();
    std::cout << channels << '\n';

    // Iterate on channels
    for (auto const& channel : channels) {
        std::cout << channel.name << std::endl;
    }

    // Get precise informations on a specific channel
    auto channel_id = channels[0].id;
    std::cout << slack::conversations().info(channel_id) << std::endl;
}